

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testAttrHandler(string *tempdir)

{
  exr_attr_opaquedata_t *peVar1;
  int iVar2;
  exr_result_t eVar3;
  exr_context_t ctxt;
  char *pcVar4;
  ostream *poVar5;
  code *pcVar6;
  char *pcVar7;
  void **ppvVar8;
  int32_t nsz;
  uint8_t data4 [4];
  void *packed;
  exr_attribute_t *foo;
  exr_attribute_t *bar;
  exr_context_t f;
  
  pcVar6 = test_pack;
  iVar2 = exr_register_attr_type_handler(0,"mytype",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar2 != 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(2);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_register_attr_type_handler ( __null, \"mytype\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                   ,(char *)0x3dc,0x318a78,(char *)pcVar6);
  }
  nsz = -1;
  data4[0] = 0xde;
  data4[1] = 0xad;
  data4[2] = 0xbe;
  data4[3] = 0xef;
  ctxt = createDummyFile("<attr_handler>");
  foo = (exr_attribute_t *)0x0;
  bar = (exr_attribute_t *)0x0;
  pcVar7 = "mytype";
  f = ctxt;
  iVar2 = exr_attr_declare_by_type(ctxt,0,"foo");
  if (iVar2 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_attr_declare_by_type (f, 0, \"foo\", \"mytype\", &foo)",(char *)0x3e4,
                   0x318a78,pcVar7);
  }
  if (foo == (exr_attribute_t *)0x0) {
    core_test_fail("foo != __null",(char *)0x3e5,0x318a78,pcVar7);
  }
  if (((foo->field_6).opaque)->unpack_func_ptr !=
      (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0) {
    core_test_fail("foo->opaque->unpack_func_ptr == __null",(char *)0x3e6,0x318a78,pcVar7);
  }
  ppvVar8 = &packed;
  eVar3 = exr_attr_opaquedata_pack(ctxt,(foo->field_6).opaque,&nsz,ppvVar8);
  if (eVar3 != 3) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x3ea,0x318a78
                   ,(char *)ppvVar8);
  }
  ppvVar8 = &packed;
  eVar3 = exr_attr_opaquedata_unpack(ctxt,(foo->field_6).opaque,&nsz,ppvVar8);
  if (eVar3 != 3) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar7 = (char *)exr_get_default_error_message(3);
    poVar5 = std::operator<<(poVar5,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed)",(char *)0x3ed,
                   0x318a78,(char *)ppvVar8);
  }
  if (ctxt == (exr_context_t)0x0) {
    eVar3 = 2;
  }
  else {
    nsz = 0;
    packed = (void *)0x0;
    eVar3 = (*ctxt->report_error)(ctxt,3,"Invalid reference to opaque data object to initialize");
    if (eVar3 == 3) {
      pcVar6 = test_pack;
      iVar2 = exr_register_attr_type_handler(ctxt,0,test_unpack,test_pack,test_hdlr_destroy);
      if (iVar2 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_register_attr_type_handler ( f, __null, &test_unpack, &test_pack, &test_hdlr_destroy)"
                       ,(char *)0x3f8,0x318a78,(char *)pcVar6);
      }
      pcVar6 = test_pack;
      iVar2 = exr_register_attr_type_handler(ctxt,"",test_unpack,test_pack,test_hdlr_destroy);
      if (iVar2 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_register_attr_type_handler ( f, \"\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                       ,(char *)0x3fc,0x318a78,(char *)pcVar6);
      }
      pcVar6 = test_pack;
      iVar2 = exr_register_attr_type_handler
                        (ctxt,"reallongreallongreallonglongname",test_unpack,test_pack,
                         test_hdlr_destroy);
      if (iVar2 != 0xc) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(0xc);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_register_attr_type_handler ( f, \"reallongreallongreallonglongname\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                       ,(char *)0x404,0x318a78,(char *)pcVar6);
      }
      pcVar6 = test_pack;
      iVar2 = exr_register_attr_type_handler(ctxt,"box2i",test_unpack,test_pack,test_hdlr_destroy);
      if (iVar2 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_register_attr_type_handler ( f, \"box2i\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                       ,(char *)0x409,0x318a78,(char *)pcVar6);
      }
      pcVar6 = test_pack;
      iVar2 = exr_register_attr_type_handler(ctxt,"mytype",test_unpack,test_pack,test_hdlr_destroy);
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_register_attr_type_handler ( f, \"mytype\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                       ,(char *)0x40b,0x318a78,(char *)pcVar6);
      }
      pcVar6 = test_pack;
      iVar2 = exr_register_attr_type_handler(ctxt,"mytype",test_unpack,test_pack,test_hdlr_destroy);
      if (iVar2 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_register_attr_type_handler ( f, \"mytype\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                       ,(char *)0x40f,0x318a78,(char *)pcVar6);
      }
      peVar1 = (foo->field_6).opaque;
      if (peVar1->unpack_func_ptr != test_unpack) {
        core_test_fail("foo->opaque->unpack_func_ptr == &test_unpack",(char *)0x410,0x318a78,
                       (char *)pcVar6);
      }
      if (peVar1->pack_func_ptr != test_pack) {
        core_test_fail("foo->opaque->pack_func_ptr == &test_pack",(char *)0x411,0x318a78,
                       (char *)pcVar6);
      }
      if (peVar1->destroy_unpacked_func_ptr != test_hdlr_destroy) {
        core_test_fail("foo->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy",(char *)0x412,
                       0x318a78,(char *)pcVar6);
      }
      pcVar7 = "mytype";
      iVar2 = exr_attr_declare_by_type(ctxt,0,"bar","mytype",&bar);
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_declare_by_type (f, 0, \"bar\", \"mytype\", &bar)",(char *)0x414,
                       0x318a78,pcVar7);
      }
      if (bar == (exr_attribute_t *)0x0) {
        core_test_fail("bar != __null",(char *)0x415,0x318a78,pcVar7);
      }
      peVar1 = (bar->field_6).opaque;
      if (peVar1->unpack_func_ptr != test_unpack) {
        core_test_fail("bar->opaque->unpack_func_ptr == &test_unpack",(char *)0x416,0x318a78,pcVar7)
        ;
      }
      if (peVar1->pack_func_ptr != test_pack) {
        core_test_fail("bar->opaque->pack_func_ptr == &test_pack",(char *)0x417,0x318a78,pcVar7);
      }
      if (peVar1->destroy_unpacked_func_ptr != test_hdlr_destroy) {
        core_test_fail("bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy",(char *)0x418,
                       0x318a78,pcVar7);
      }
      pcVar7 = (char *)0x4;
      eVar3 = exr_attr_opaquedata_set_unpacked(ctxt,(foo->field_6).opaque,data4,4);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4)",(char *)0x41b,
                       0x318a78,pcVar7);
      }
      s_unpack_fail = 1;
      ppvVar8 = &packed;
      eVar3 = exr_attr_opaquedata_unpack(ctxt,(foo->field_6).opaque,&nsz,ppvVar8);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed)",(char *)0x41f,
                       0x318a78,(char *)ppvVar8);
      }
      s_unpack_fail = 0;
      nsz = 0;
      packed = (void *)0x0;
      eVar3 = (*ctxt->report_error)(ctxt,3,"Invalid reference to opaque data object to initialize");
      if (eVar3 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_pack (f, __null, &nsz, &packed)",(char *)0x426,0x318a78,
                       (char *)ppvVar8);
      }
      if (nsz != 0) {
        core_test_fail("nsz == 0",(char *)0x427,0x318a78,(char *)ppvVar8);
      }
      if (packed != (void *)0x0) {
        core_test_fail("packed == __null",(char *)0x428,0x318a78,(char *)ppvVar8);
      }
      ppvVar8 = &packed;
      eVar3 = exr_attr_opaquedata_pack(ctxt,(foo->field_6).opaque,&nsz,ppvVar8);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x42b,
                       0x318a78,(char *)ppvVar8);
      }
      s_pack_fail = 1;
      ppvVar8 = &packed;
      eVar3 = exr_attr_opaquedata_pack(ctxt,(foo->field_6).opaque,&nsz,ppvVar8);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x42f,
                       0x318a78,(char *)ppvVar8);
      }
      s_pack_fail = 0;
      eVar3 = (*ctxt->standard_error)(ctxt,3);
      if (eVar3 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_set_packed (f, __null, data4, 4)",(char *)0x437,0x318a78
                       ,(char *)ppvVar8);
      }
      pcVar7 = (char *)0x4;
      eVar3 = exr_attr_opaquedata_set_packed(ctxt,(bar->field_6).opaque,data4,4);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4)",(char *)0x439,
                       0x318a78,pcVar7);
      }
      pcVar7 = (char *)0x4;
      eVar3 = exr_attr_opaquedata_set_packed(ctxt,(bar->field_6).opaque,data4,4);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4)",(char *)0x43b,
                       0x318a78,pcVar7);
      }
      pcVar7 = (char *)0xffffffffffffffff;
      eVar3 = exr_attr_opaquedata_set_packed(ctxt,(bar->field_6).opaque,data4,-1);
      if (eVar3 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar4);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, -1)",(char *)0x43e,
                       0x318a78,pcVar7);
      }
      peVar1 = (bar->field_6).opaque;
      if (peVar1->unpack_func_ptr != test_unpack) {
        core_test_fail("bar->opaque->unpack_func_ptr == &test_unpack",(char *)0x43f,0x318a78,pcVar7)
        ;
      }
      if (peVar1->pack_func_ptr != test_pack) {
        core_test_fail("bar->opaque->pack_func_ptr == &test_pack",(char *)0x440,0x318a78,pcVar7);
      }
      if (peVar1->destroy_unpacked_func_ptr != test_hdlr_destroy) {
        core_test_fail("bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy",(char *)0x441,
                       0x318a78,pcVar7);
      }
      if (peVar1->unpacked_data != (void *)0x0) {
        core_test_fail("bar->opaque->unpacked_data == __null",(char *)0x442,0x318a78,pcVar7);
      }
      s_unpack_fail = 1;
      ppvVar8 = &packed;
      eVar3 = exr_attr_opaquedata_unpack(ctxt,peVar1,&nsz,ppvVar8);
      if (eVar3 != 0x17) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x17);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(0x17);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed)",(char *)0x447,
                       0x318a78,(char *)ppvVar8);
      }
      s_unpack_fail = 0;
      ppvVar8 = &packed;
      eVar3 = exr_attr_opaquedata_unpack(ctxt,(bar->field_6).opaque,&nsz,ppvVar8);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed)",(char *)0x44a,
                       0x318a78,(char *)ppvVar8);
      }
      if (((bar->field_6).opaque)->unpacked_data == (void *)0x0) {
        core_test_fail("bar->opaque->unpacked_data != __null",(char *)0x44b,0x318a78,(char *)ppvVar8
                      );
      }
      s_malloc_fail_on = 1;
      pcVar7 = (char *)0x4;
      eVar3 = exr_attr_opaquedata_set_packed(ctxt,(bar->field_6).opaque,data4,4);
      s_malloc_fail_on = 0;
      if (eVar3 != 1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar4);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(1);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4)",(char *)0x44f,
                       0x318a78,pcVar7);
      }
      if (((bar->field_6).opaque)->unpacked_data == (void *)0x0) {
        core_test_fail("bar->opaque->unpacked_data != __null",(char *)0x451,0x318a78,pcVar7);
      }
      pcVar7 = (char *)0x4;
      eVar3 = exr_attr_opaquedata_set_packed(ctxt,(bar->field_6).opaque,data4,4);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4)",(char *)0x454,
                       0x318a78,pcVar7);
      }
      pcVar7 = (char *)0x4;
      eVar3 = exr_attr_opaquedata_set_unpacked(ctxt,(foo->field_6).opaque,data4,4);
      if (eVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4)",(char *)0x457,
                       0x318a78,pcVar7);
      }
      s_pack_fail = 1;
      ppvVar8 = &packed;
      eVar3 = exr_attr_opaquedata_pack(ctxt,(foo->field_6).opaque,&nsz,ppvVar8);
      if (eVar3 != 0x17) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x17);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(0x17);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x45b,
                       0x318a78,(char *)ppvVar8);
      }
      s_pack_fail = 2;
      ppvVar8 = &packed;
      eVar3 = exr_attr_opaquedata_pack(ctxt,(foo->field_6).opaque,&nsz,ppvVar8);
      if (eVar3 != 0x17) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x17);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(0x17);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x45f,
                       0x318a78,(char *)ppvVar8);
      }
      s_pack_fail = 0;
      s_malloc_fail_on = 1;
      ppvVar8 = &packed;
      eVar3 = exr_attr_opaquedata_pack(ctxt,(foo->field_6).opaque,&nsz,ppvVar8);
      s_malloc_fail_on = 0;
      if (eVar3 != 1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(eVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar7 = (char *)exr_get_default_error_message(1);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x463,
                       0x318a78,(char *)ppvVar8);
      }
      exr_finish(&f);
      return;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar3);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar7 = (char *)exr_get_default_error_message(eVar3);
  poVar5 = std::operator<<(poVar5,pcVar7);
  poVar5 = std::operator<<(poVar5,"\n    expected: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar7 = (char *)exr_get_default_error_message(3);
  poVar5 = std::operator<<(poVar5,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar5);
  core_test_fail("exr_attr_opaquedata_unpack (f, __null, &nsz, &packed)",(char *)0x3f3,0x318a78,
                 (char *)ppvVar8);
}

Assistant:

void
testAttrHandler (const std::string& tempdir)
{
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_register_attr_type_handler (
            NULL, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));

    int32_t nsz = -1;
    void*   packed;
    uint8_t data4[] = {0xDE, 0xAD, 0xBE, 0xEF};

    exr_context_t    f   = createDummyFile ("<attr_handler>");
    exr_attribute_t *foo = NULL, *bar = NULL;
    EXRCORE_TEST_RVAL (exr_attr_declare_by_type (f, 0, "foo", "mytype", &foo));
    EXRCORE_TEST (foo != NULL);
    EXRCORE_TEST (foo->opaque->unpack_func_ptr == NULL);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_unpack (NULL, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_unpack (f, NULL, &nsz, &packed));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, NULL, &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_register_attr_type_handler (
            f,
            "reallongreallongreallonglongname",
            &test_unpack,
            &test_pack,
            &test_hdlr_destroy));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "box2i", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL (exr_register_attr_type_handler (
        f, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST (foo->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (foo->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (foo->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);

    EXRCORE_TEST_RVAL (exr_attr_declare_by_type (f, 0, "bar", "mytype", &bar));
    EXRCORE_TEST (bar != NULL);
    EXRCORE_TEST (bar->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (bar->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4));
    // make sure it keeps the unpacked value
    s_unpack_fail = 1;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed));
    s_unpack_fail = 0;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_pack (NULL, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_pack (f, NULL, &nsz, &packed));
    EXRCORE_TEST (nsz == 0);
    EXRCORE_TEST (packed == NULL);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    // make sure it keeps the old value
    s_pack_fail = 1;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 0;

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_set_packed (NULL, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_set_packed (f, NULL, data4, 4));
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, -1));
    EXRCORE_TEST (bar->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (bar->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);
    EXRCORE_TEST (bar->opaque->unpacked_data == NULL);

    s_unpack_fail = 1;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed));
    s_unpack_fail = 0;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed));
    EXRCORE_TEST (bar->opaque->unpacked_data != NULL);

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    // make sure state didn't change
    EXRCORE_TEST (bar->opaque->unpacked_data != NULL);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4));
    s_pack_fail = 1;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 2;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 0;
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));

    exr_finish (&f);
}